

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network_id.c
# Opt level: O3

FUNCTION_RETURN getAdapterInfos(OsAdapterInfo *adapterInfos,size_t *adapter_info_size)

{
  long *plVar1;
  char *__s1;
  int iVar2;
  int iVar3;
  FUNCTION_RETURN FVar4;
  char *__ptr;
  long *plVar5;
  long lVar6;
  ulong uVar7;
  char *__s2;
  ulong uVar8;
  sockaddr_in *s1;
  short *psVar9;
  ifaddrs *ifaddr;
  long *local_38;
  
  iVar2 = getifaddrs(&local_38);
  if (iVar2 == -1) {
    perror("getifaddrs");
    FVar4 = FUNC_RET_ERROR;
  }
  else {
    if (adapterInfos != (OsAdapterInfo *)0x0) {
      memset(adapterInfos,0,*adapter_info_size * 0x414);
    }
    if (local_38 == (long *)0x0) {
      uVar7 = 0;
      __ptr = (char *)calloc(1,0);
    }
    else {
      iVar2 = 0;
      plVar5 = local_38;
      do {
        plVar1 = plVar5 + 3;
        plVar5 = (long *)*plVar5;
        iVar2 = (iVar2 + 1) - (uint)(*plVar1 == 0);
      } while (plVar5 != (long *)0x0);
      __ptr = (char *)calloc(1,(ulong)(uint)(iVar2 * 0x401));
      uVar7 = 0;
      for (plVar5 = local_38; plVar5 != (long *)0x0; plVar5 = (long *)*plVar5) {
        psVar9 = (short *)plVar5[3];
        if (psVar9 != (short *)0x0) {
          iVar2 = (int)uVar7;
          __s1 = (char *)plVar5[1];
          if (0 < iVar2) {
            uVar8 = 0;
            __s2 = __ptr;
            do {
              iVar3 = strcmp(__s1,__s2);
              if (iVar3 == 0) {
                iVar2 = (int)uVar8;
                goto LAB_002c9883;
              }
              uVar8 = uVar8 + 1;
              __s2 = __s2 + 0x401;
            } while (uVar7 != uVar8);
          }
          strncpy(__ptr + (uint)(iVar2 * 0x401),__s1,0x401);
          if (adapterInfos == (OsAdapterInfo *)0x0) {
            uVar7 = (ulong)(iVar2 + 1);
          }
          else {
            if (uVar7 < *adapter_info_size) {
              strncpy(adapterInfos[uVar7].description,(char *)plVar5[1],0x400);
            }
            uVar7 = (ulong)(iVar2 + 1);
            psVar9 = (short *)plVar5[3];
LAB_002c9883:
            if (*psVar9 == 0x11) {
              if (((adapterInfos != (OsAdapterInfo *)0x0) && (plVar5[6] != 0)) &&
                 ((ulong)(long)iVar2 < *adapter_info_size)) {
                lVar6 = 0;
                do {
                  adapterInfos[iVar2].mac_address[lVar6] = *(uchar *)((long)psVar9 + lVar6 + 0xc);
                  lVar6 = lVar6 + 1;
                } while (lVar6 != 6);
              }
            }
            else if (((*psVar9 == 2) && (adapterInfos != (OsAdapterInfo *)0x0)) &&
                    ((ulong)(long)iVar2 < *adapter_info_size)) {
              *(undefined4 *)adapterInfos[iVar2].ipv4_address = *(undefined4 *)(psVar9 + 2);
            }
          }
        }
      }
    }
    *adapter_info_size = uVar7;
    freeifaddrs(local_38);
    free(__ptr);
    FVar4 = FUNC_RET_OK;
  }
  return FVar4;
}

Assistant:

FUNCTION_RETURN getAdapterInfos(OsAdapterInfo * adapterInfos,
		size_t * adapter_info_size) {

	FUNCTION_RETURN f_return = FUNC_RET_OK;
	struct ifaddrs *ifaddr, *ifa;
	int family, n = 0, if_name_position;
	unsigned int if_num, if_max;
	//char host[NI_MAXHOST];
	char *ifnames;

	if (getifaddrs(&ifaddr) == -1) {
		perror("getifaddrs");
		return FUNC_RET_ERROR;
	}

	if (adapterInfos != NULL) {
		memset(adapterInfos, 0, (*adapter_info_size) * sizeof(OsAdapterInfo));
	}

	/* count the maximum number of interfaces */
	for (ifa = ifaddr, if_max = 0; ifa != NULL; ifa = ifa->ifa_next, n++) {
		if (ifa->ifa_addr == NULL) {
			continue;
		}
		if_max++;
	}

	/* allocate space for names */
	ifnames = (char*) malloc(NI_MAXHOST * if_max);
	memset(ifnames, 0, NI_MAXHOST * if_max);
	/* Walk through linked list, maintaining head pointer so we
	 can free list later */
	for (ifa = ifaddr, n = 0, if_num = 0; ifa != NULL;
			ifa = ifa->ifa_next, n++) {
		if (ifa->ifa_addr == NULL) {
			continue;
		}
		if_name_position = ifname_position(ifnames, ifa->ifa_name, if_num);
		//interface name not seen en advance
		if (if_name_position < 0) {
			strncpy(&ifnames[if_num * NI_MAXHOST], ifa->ifa_name, NI_MAXHOST);
			if (adapterInfos != NULL && if_num < *adapter_info_size) {
				strncpy(adapterInfos[if_num].description, ifa->ifa_name,
				NI_MAXHOST-1);
			}
			if_name_position = if_num;
			if_num++;
			if (adapterInfos == NULL) {
				continue;
			}
		}
		family = ifa->ifa_addr->sa_family;
		/* Display interface name and family (including symbolic
		 form of the latter for the common families) */
#ifdef _DEBUG
		printf("%-8s %s (%d)\n", ifa->ifa_name,
				(family == AF_PACKET) ? "AF_PACKET" :
				(family == AF_INET) ? "AF_INET" :
				(family == AF_INET6) ? "AF_INET6" : "???", family);
#endif
		/* For an AF_INET* interface address, display the address
		 * || family == AF_INET6*/
		if (family == AF_INET) {
			/*
			 s = getnameinfo(ifa->ifa_addr,
			 (family == AF_INET) ?
			 sizeof(struct sockaddr_in) :
			 sizeof(struct sockaddr_in6), host, NI_MAXHOST,
			 NULL, 0, NI_NUMERICHOST);

			 #ifdef _DEBUG
			 s = getnameinfo(ifa->ifa_addr, sizeof(struct sockaddr_in), host,
			 NI_MAXHOST,
			 NULL, 0, NI_NUMERICHOST);
			 if (s != 0) {
			 printf("getnameinfo() failed: %s\n", gai_strerror(s));
			 }
			 printf("\t\taddress: <%s>\n", host);
			 #endif
			 */
			if (adapterInfos != NULL && if_name_position < *adapter_info_size) {
				struct sockaddr_in *s1 = (struct sockaddr_in*) ifa->ifa_addr;
				in_addr_t iaddr = s1->sin_addr.s_addr;
				adapterInfos[if_name_position].ipv4_address[0] = (iaddr
						& 0x000000ff);
				adapterInfos[if_name_position].ipv4_address[1] = (iaddr
						& 0x0000ff00) >> 8;
				adapterInfos[if_name_position].ipv4_address[2] = (iaddr
						& 0x00ff0000) >> 16;
				adapterInfos[if_name_position].ipv4_address[3] = (iaddr
						& 0xff000000) >> 24;
			}
		} else if (family == AF_PACKET && ifa->ifa_data != NULL) {
			struct sockaddr_ll *s1 = (struct sockaddr_ll*) ifa->ifa_addr;
			if (adapterInfos != NULL && if_name_position < *adapter_info_size) {
				for (int i = 0; i < 6; i++) {
					adapterInfos[if_name_position].mac_address[i] =
							s1->sll_addr[i];
#ifdef _DEBUG
					printf("%02x:", s1->sll_addr[i]);
#endif
				}
#ifdef _DEBUG
				printf("\t %s\n", ifa->ifa_name);
#endif

			}
		}
	}

	*adapter_info_size = if_num;
	if (adapterInfos == NULL) {
		f_return = FUNC_RET_OK;
	} else if (*adapter_info_size < if_num) {
		f_return = FUNC_RET_BUFFER_TOO_SMALL;
	}
	freeifaddrs(ifaddr);
	free(ifnames);
	return f_return;
}